

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int add_var(JSContext *ctx,JSFunctionDef *fd,JSAtom name)

{
  JSVarDef *pJVar1;
  JSVarDef *pJVar2;
  JSAtomStruct *pJVar3;
  int iVar4;
  uint uVar5;
  
  if (fd->var_count < 0x10000) {
    iVar4 = js_resize_array(ctx,&fd->vars,0x10,&fd->var_size,fd->var_count + 1);
    if (iVar4 == 0) {
      iVar4 = fd->var_count;
      fd->var_count = iVar4 + 1;
      pJVar1 = fd->vars + iVar4;
      pJVar2 = fd->vars + iVar4;
      pJVar2->var_name = 0;
      pJVar2->scope_level = 0;
      *(undefined8 *)&pJVar2->scope_next = 0;
      uVar5 = 0x7fffff80;
      if (0xd1 < (int)name) {
        pJVar3 = ctx->rt->atom_array[name];
        (pJVar3->header).ref_count = (pJVar3->header).ref_count + 1;
        uVar5 = *(uint *)&pJVar1->field_0xc | 0x7fffff80;
      }
      pJVar1->var_name = name;
      *(uint *)&pJVar1->field_0xc = uVar5;
      return fd->var_count + -1;
    }
  }
  else {
    JS_ThrowInternalError(ctx,"too many local variables");
  }
  return -1;
}

Assistant:

static int add_var(JSContext *ctx, JSFunctionDef *fd, JSAtom name)
{
    JSVarDef *vd;

    /* the local variable indexes are currently stored on 16 bits */
    if (fd->var_count >= JS_MAX_LOCAL_VARS) {
        JS_ThrowInternalError(ctx, "too many local variables");
        return -1;
    }
    if (js_resize_array(ctx, (void **)&fd->vars, sizeof(fd->vars[0]),
                        &fd->var_size, fd->var_count + 1))
        return -1;
    vd = &fd->vars[fd->var_count++];
    memset(vd, 0, sizeof(*vd));
    vd->var_name = JS_DupAtom(ctx, name);
    vd->func_pool_idx = -1;
    return fd->var_count - 1;
}